

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

Gia_Man_t *
Gia_ManIsoReduce(Gia_Man_t *pInit,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                int fDualOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  abctime aVar8;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar9;
  int *pStr;
  void *pvVar10;
  Vec_Str_t *__ptr;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  Vec_Int_t **pvPiPerm;
  abctime time;
  abctime time_00;
  int iVar13;
  int iVar14;
  size_t __size;
  char *pStr_00;
  long lVar15;
  ulong uVar16;
  int iPo;
  ulong local_a0;
  int local_94;
  Vec_Ptr_t *local_90;
  int local_88;
  int nUsedPos;
  Vec_Int_t *local_80;
  Gia_Man_t *local_78;
  Vec_Ptr_t **local_70;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  abctime local_58;
  Gia_Man_t *local_50;
  Vec_Ptr_t **local_48;
  Gia_Man_t *local_40;
  Vec_Ptr_t *local_38;
  
  local_94 = fDualOut;
  local_88 = fVerbose;
  local_70 = pvPiPerms;
  local_58 = Abc_Clock();
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    *pvPosEquivs = (Vec_Ptr_t *)0x0;
  }
  local_48 = pvPosEquivs;
  if (local_70 != (Vec_Ptr_t **)0x0) {
    lVar15 = (long)pInit->vCos->nSize - (long)pInit->nRegs;
    iVar14 = (int)lVar15;
    pVVar5 = Vec_PtrAlloc(iVar14);
    pVVar5->nSize = iVar14;
    memset(pVVar5->pArray,0,lVar15 * 8);
    *local_70 = pVVar5;
  }
  uVar1 = pInit->vCos->nSize - pInit->nRegs;
  if (local_94 == 0) {
    pGVar7 = pInit;
    if (uVar1 == 1) goto LAB_005e4fa1;
  }
  else {
    if ((uVar1 & 1) != 0) {
      __assert_fail("(Gia_ManPoNum(pInit) & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                    ,0x443,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    if (uVar1 == 2) goto LAB_005e4fa1;
    pGVar6 = Gia_ManTransformMiter(pInit);
    pGVar7 = Gia_ManSeqStructSweep(pGVar6,1,1,0);
    Gia_ManStop(pGVar6);
  }
  pVVar5 = Gia_IsoDeriveEquivPos(pGVar7,1,fVeryVerbose);
  if (pVVar5 == (Vec_Ptr_t *)0x0) {
    if (local_94 != 0) {
      Gia_ManStop(pGVar7);
    }
    local_78 = (Gia_Man_t *)0x0;
  }
  else {
    uVar2 = Vec_IntCountNonTrivial(pVVar5,&nUsedPos);
    pStr = (int *)(ulong)(uint)(pGVar7->vCos->nSize - pGVar7->nRegs);
    uVar1 = pVVar5->nSize;
    printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
           ,pStr,(ulong)uVar1,(ulong)(uint)nUsedPos,(ulong)uVar2);
    aVar8 = Abc_Clock();
    Abc_PrintTime((int)aVar8 - (int)local_58,(char *)pStr,time);
    if (fEstimate != 0) {
      Vec_VecFree((Vec_Vec_t *)pVVar5);
LAB_005e4fa1:
      pGVar7 = Gia_ManDup(pInit);
      return pGVar7;
    }
    p = Vec_PtrAlloc(100);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_a0 = 0;
    uVar2 = 0;
    local_90 = p;
    local_68 = uVar1;
    local_50 = pGVar7;
    local_40 = pInit;
    local_38 = pVVar5;
    while (pVVar5 = local_38, uVar2 != local_68) {
      pVVar9 = (Vec_Int_t *)Vec_PtrEntry(local_38,uVar2);
      iVar14 = pVVar9->nSize;
      local_80 = pVVar9;
      local_64 = uVar2;
      if ((long)iVar14 < 2) {
        pStr = (int *)malloc(0x10);
        pStr[1] = iVar14;
        *pStr = iVar14;
        if (iVar14 == 0) {
          __size = 0;
          pvVar10 = (void *)0x0;
        }
        else {
          __size = (long)iVar14 << 2;
          pvVar10 = malloc(__size);
        }
        pVVar9 = local_80;
        *(void **)(pStr + 2) = pvVar10;
        memcpy(pvVar10,local_80->pArray,__size);
        Vec_PtrPush(local_90,pStr);
        uVar16 = local_a0;
        for (iVar14 = 0; iVar14 < pVVar9->nSize; iVar14 = iVar14 + 1) {
          uVar1 = (int)uVar16 + iVar14 + 1;
          pStr = (int *)(ulong)uVar1;
          if ((int)uVar1 % 100 == 0) {
            printf("%6d finished...\r");
            pVVar9 = local_80;
          }
        }
        local_a0 = (ulong)(uint)((int)uVar16 + iVar14);
        p = local_90;
      }
      else {
        if (local_88 != 0) {
          iPo = Vec_IntEntry(pVVar9,0);
          printf("%6d %6d %6d : ",(ulong)uVar2,(ulong)(uint)pVVar9->nSize,(ulong)(uint)iPo);
          pGVar6 = Gia_ManDupCones(pGVar7,&iPo,1,1);
          Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
          Gia_ManStop(pGVar6);
        }
        p = local_90;
        local_60 = local_90->nSize;
        pVVar5 = Vec_PtrAlloc(100);
        pStr = (int *)0x0;
        uVar16 = local_a0;
        while (iVar14 = (int)pStr, iVar14 < local_80->nSize) {
          local_78 = (Gia_Man_t *)CONCAT44(local_78._4_4_,iVar14);
          iPo = Vec_IntEntry(local_80,iVar14);
          uVar1 = (int)uVar16 + 1;
          if ((int)uVar1 % 100 == 0) {
            printf("%6d finished...\r",(ulong)uVar1);
          }
          local_a0 = (ulong)uVar1;
          if (local_70 == (Vec_Ptr_t **)0x0) {
            pvPiPerm = (Vec_Int_t **)0x0;
          }
          else {
            if ((*local_70)->pArray[iPo] != (void *)0x0) {
              __assert_fail("pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                            ,0x480,
                            "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                           );
            }
            pvPiPerm = (Vec_Int_t **)((*local_70)->pArray + iPo);
          }
          __ptr = Gia_ManIsoFindString(pGVar7,iPo,0,pvPiPerm);
          local_5c = pVVar5->nSize;
          iVar14 = 0;
          iVar13 = 0;
          if (0 < local_5c) {
            iVar14 = local_5c;
            iVar13 = 0;
          }
          for (; iVar4 = iVar14, iVar14 != iVar13; iVar13 = iVar13 + 1) {
            pvVar10 = Vec_PtrEntry(pVVar5,iVar13);
            if (__ptr == (Vec_Str_t *)0x0 || pvVar10 == (void *)0x0) {
              iVar3 = ((__ptr != (Vec_Str_t *)0x0) - 1) + (uint)(pvVar10 == (void *)0x0);
            }
            else {
              iVar3 = __ptr->nSize;
              if (iVar3 == *(int *)((long)pvVar10 + 4)) {
                iVar3 = memcmp(__ptr->pArray,*(void **)((long)pvVar10 + 8),(long)iVar3);
              }
              else {
                iVar3 = iVar3 - *(int *)((long)pvVar10 + 4);
              }
            }
            iVar4 = iVar13;
            if (iVar3 == 0) break;
          }
          p = local_90;
          uVar16 = local_a0;
          if (iVar4 == local_5c) {
            Vec_PtrPush(pVVar5,__ptr);
            pVVar9 = Vec_IntAlloc(8);
            Vec_PtrPush(p,pVVar9);
          }
          else {
            free(__ptr->pArray);
            free(__ptr);
          }
          pVVar9 = (Vec_Int_t *)Vec_PtrEntry(p,iVar4 + local_60);
          Vec_IntPush(pVVar9,iPo);
          pGVar7 = local_50;
          pStr = (int *)(ulong)((int)local_78 + 1);
        }
        local_a0 = uVar16;
        Vec_VecFree((Vec_Vec_t *)pVVar5);
        pInit = local_40;
      }
      uVar2 = local_64 + 1;
    }
    if ((int)local_a0 != pGVar7->vCos->nSize - pGVar7->nRegs) {
      __assert_fail("Counter == Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                    ,0x499,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    Vec_VecSortByFirstInt((Vec_Vec_t *)p,(int)pStr);
    Vec_VecFree((Vec_Vec_t *)pVVar5);
    pVVar9 = Vec_IntAlloc(100);
    iVar14 = ((Vec_Vec_t *)p)->nSize;
    for (iVar13 = 0; iVar13 < iVar14; iVar13 = iVar13 + 1) {
      pVVar11 = (Vec_Int_t *)Vec_PtrEntry(local_90,iVar13);
      iVar4 = Vec_IntEntry(pVVar11,0);
      Vec_IntPush(pVVar9,iVar4);
    }
    if (local_94 != 0) {
      iVar14 = pVVar9->nSize;
      pVVar11 = Vec_IntAlloc(iVar14);
      iVar13 = 0;
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      for (; iVar14 != iVar13; iVar13 = iVar13 + 1) {
        iVar4 = Vec_IntEntry(pVVar9,iVar13);
        Vec_IntPush(pVVar11,iVar4 * 2);
        Vec_IntPush(pVVar11,iVar4 * 2 + 1);
      }
      Vec_IntFree(pVVar9);
      Gia_ManStop(local_50);
      pGVar7 = pInit;
      pVVar9 = pVVar11;
    }
    pGVar6 = Gia_ManDupCones(pGVar7,pVVar9->pArray,pVVar9->nSize,0);
    Vec_IntFree(pVVar9);
    pVVar5 = local_90;
    uVar1 = Vec_IntCountNonTrivial(local_90,&nUsedPos);
    aVar8 = local_58;
    uVar2 = pGVar7->vCos->nSize - pGVar7->nRegs;
    pStr_00 = (char *)(ulong)uVar2;
    local_78 = pGVar6;
    if (local_94 == 0) {
      printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
             ,pStr_00,(ulong)(uint)pVVar5->nSize,(ulong)(uint)nUsedPos,(ulong)uVar1);
    }
    else {
      pStr_00 = (char *)((long)(int)uVar2 / 2 & 0xffffffff);
      printf("Reduced %d dual outputs to %d dual outputs.  ",pStr_00,
             (long)(pGVar6->vCos->nSize - pGVar6->nRegs) / 2 & 0xffffffff);
    }
    aVar12 = Abc_Clock();
    Abc_PrintTime((int)aVar12 - (int)aVar8,pStr_00,time_00);
    pVVar5 = local_90;
    if (local_88 != 0) {
      puts("Nontrivial classes:");
      local_a0 = CONCAT44(local_a0._4_4_,pVVar5->nSize);
      for (uVar1 = 0; (int)uVar1 < (int)local_a0; uVar1 = uVar1 + 1) {
        for (iVar14 = 0; pVVar9 = Vec_VecEntryInt((Vec_Vec_t *)pVVar5,uVar1), iVar14 < pVVar9->nSize
            ; iVar14 = iVar14 + 1) {
          pVVar9 = Vec_VecEntryInt((Vec_Vec_t *)pVVar5,uVar1);
          uVar2 = Vec_IntEntry(pVVar9,iVar14);
          iVar13 = Vec_VecLevelSize((Vec_Vec_t *)pVVar5,uVar1);
          if (iVar13 == 1) break;
          if (iVar14 == 0) {
            printf(" %4d : {",(ulong)uVar1);
          }
          printf(" %d",(ulong)uVar2);
          pVVar5 = local_90;
          iVar13 = Vec_VecLevelSize((Vec_Vec_t *)local_90,uVar1);
          if (iVar14 == iVar13 + -1) {
            puts(" }");
          }
        }
      }
    }
    if (local_48 == (Vec_Ptr_t **)0x0) {
      Vec_VecFree((Vec_Vec_t *)pVVar5);
    }
    else {
      *local_48 = pVVar5;
    }
  }
  return local_78;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce( Gia_Man_t * pInit, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fDualOut, int fVerbose, int fVeryVerbose )
{ 
    Gia_Man_t * p, * pPart;
    Vec_Ptr_t * vEquivs, * vEquivs2, * vStrings;
    Vec_Int_t * vRemain, * vLevel, * vLevel2;
    Vec_Str_t * vStr, * vStr2;
    int i, k, s, sStart, iPo, Counter;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    if ( pvPosEquivs )
        *pvPosEquivs = NULL;
    if ( pvPiPerms )
        *pvPiPerms = Vec_PtrStart( Gia_ManPoNum(pInit) );

    if ( fDualOut )
    {
        assert( (Gia_ManPoNum(pInit) & 1) == 0 );
        if ( Gia_ManPoNum(pInit) == 2 )
            return Gia_ManDup(pInit);
        p = Gia_ManTransformMiter( pInit );
        p = Gia_ManSeqStructSweep( pPart = p, 1, 1, 0 );
        Gia_ManStop( pPart );
    }
    else
    {
        if ( Gia_ManPoNum(pInit) == 1 )
            return Gia_ManDup(pInit);
        p = pInit;
    }

    // create preliminary equivalences
    vEquivs = Gia_IsoDeriveEquivPos( p, 1, fVeryVerbose );
    if ( vEquivs == NULL )
    {
        if ( fDualOut )
            Gia_ManStop( p );
        return NULL;
    }
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
        return Gia_ManDup(pInit);
    }

    // perform refinement of equivalence classes
    Counter = 0;
    vEquivs2 = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) < 2 )
        {
            Vec_PtrPush( vEquivs2, Vec_IntDup(vLevel) );
            for ( k = 0; k < Vec_IntSize(vLevel); k++ )
                if ( ++Counter % 100 == 0 )
                    printf( "%6d finished...\r", Counter );
            continue;
        }

        if ( fVerbose )
        {
            iPo = Vec_IntEntry(vLevel, 0);
            printf( "%6d %6d %6d : ", i, Vec_IntSize(vLevel), iPo );
            pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
            Gia_ManPrintStats(pPart, NULL);
            Gia_ManStop( pPart );
        }

        sStart = Vec_PtrSize( vEquivs2 ); 
        vStrings = Vec_PtrAlloc( 100 );
        Vec_IntForEachEntry( vLevel, iPo, k )
        {
            if ( ++Counter % 100 == 0 )
                printf( "%6d finished...\r", Counter );
            assert( pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL );
            vStr = Gia_ManIsoFindString( p, iPo, 0, pvPiPerms ? (Vec_Int_t **)Vec_PtrArray(*pvPiPerms) + iPo : NULL );

//            printf( "Output %2d : ", iPo );
//            Vec_IntPrint( Vec_PtrArray(*pvPiPerms)[iPo] );

            // check if this string already exists
            Vec_PtrForEachEntry( Vec_Str_t *, vStrings, vStr2, s )
                if ( Vec_StrCompareVec(vStr, vStr2) == 0 )
                    break;
            if ( s == Vec_PtrSize(vStrings) )
            {
                Vec_PtrPush( vStrings, vStr );
                Vec_PtrPush( vEquivs2, Vec_IntAlloc(8) );
            }
            else
                Vec_StrFree( vStr );
            // add this entry to the corresponding level
            vLevel2 = (Vec_Int_t *)Vec_PtrEntry( vEquivs2, sStart + s );
            Vec_IntPush( vLevel2, iPo );
        }
//        if ( Vec_PtrSize(vEquivs2) - sStart > 1 )
//            printf( "Refined class %d into %d classes.\n", i, Vec_PtrSize(vEquivs2) - sStart );
        Vec_VecFree( (Vec_Vec_t *)vStrings );
    }
    assert( Counter == Gia_ManPoNum(p) );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vEquivs2, 0 );
    Vec_VecFree( (Vec_Vec_t *)vEquivs );
    vEquivs = vEquivs2;

    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    if ( fDualOut )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vRemain) );
        int i, Entry;
        Vec_IntForEachEntry( vRemain, Entry, i )
        {
//            printf( "%d ", Entry );
            Vec_IntPush( vTemp, 2*Entry );
            Vec_IntPush( vTemp, 2*Entry+1 );
        }
//        printf( "\n" );
        Vec_IntFree( vRemain );
        vRemain = vTemp;
        Gia_ManStop( p );
        p = pInit;
    }


    // derive the resulting AIG
    pPart = Gia_ManDupCones( p, Vec_IntArray(vRemain), Vec_IntSize(vRemain), 0 );
    Vec_IntFree( vRemain );
    // report the results
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    if ( !fDualOut )
        printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
            Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    else
        printf( "Reduced %d dual outputs to %d dual outputs.  ", Gia_ManPoNum(p)/2, Gia_ManPoNum(pPart)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = vEquivs;
    else
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}